

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

void Io_WriteBlifLogic(Abc_Ntk_t *pNtk,char *FileName,int fWriteLatches)

{
  Abc_Ntk_t *pNtk_00;
  
  pNtk_00 = Abc_NtkToNetlist(pNtk);
  if (pNtk_00 != (Abc_Ntk_t *)0x0) {
    Io_WriteBlif(pNtk_00,FileName,fWriteLatches,0,0);
    Abc_NtkDelete(pNtk_00);
    return;
  }
  fwrite("Writing BLIF has failed.\n",0x19,1,_stdout);
  return;
}

Assistant:

void Io_WriteBlifLogic( Abc_Ntk_t * pNtk, char * FileName, int fWriteLatches )
{
    Abc_Ntk_t * pNtkTemp;
    // derive the netlist
    pNtkTemp = Abc_NtkToNetlist(pNtk);
    if ( pNtkTemp == NULL )
    {
        fprintf( stdout, "Writing BLIF has failed.\n" );
        return;
    }
    Io_WriteBlif( pNtkTemp, FileName, fWriteLatches, 0, 0 );
    Abc_NtkDelete( pNtkTemp );
}